

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fancy_tools.cxx
# Opt level: O0

void __thiscall fancy_tools::process(fancy_tools *this,cl_parser *cl)

{
  bool bVar1;
  xr_ini_file *this_00;
  undefined8 uVar2;
  char *pcVar3;
  allocator<char> local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  size_t local_78;
  size_t i;
  char *profile;
  char *level;
  undefined1 local_58 [8];
  string path;
  xr_file_system *fs;
  char *local_20;
  char *fancy_config;
  cl_parser *cl_local;
  fancy_tools *this_local;
  
  fancy_config = (char *)cl;
  cl_local = (cl_parser *)this;
  bVar1 = check_paths(this);
  if ((bVar1) &&
     (bVar1 = cl_parser::get_string((cl_parser *)fancy_config,"-fancy",&local_20), bVar1)) {
    this_00 = (xr_ini_file *)operator_new(0x18);
    xray_re::xr_ini_file::xr_ini_file(this_00,local_20);
    this->m_ini = this_00;
    bVar1 = xray_re::xr_ini_file::empty(this->m_ini);
    if (bVar1) {
      xray_re::msg("can\'t load %s",local_20);
    }
    else {
      path.field_2._8_8_ = xray_re::xr_file_system::instance();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_58,"gamedata.fancy\\",(allocator<char> *)((long)&level + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&level + 7));
      bVar1 = cl_parser::get_string((cl_parser *)fancy_config,"-dir",(string *)local_58);
      if (bVar1) {
        xray_re::xr_file_system::append_path_separator((string *)local_58);
      }
      std::__cxx11::string::append(local_58);
      bVar1 = xray_re::xr_file_system::create_path
                        ((xr_file_system *)path.field_2._8_8_,(string *)local_58);
      if (bVar1) {
        local_78 = 0;
        while (bVar1 = xray_re::xr_ini_file::r_line
                                 (this->m_ini,"levels",local_78,&profile,(char **)&i), bVar1) {
          bVar1 = xray_re::xr_file_system::folder_exist
                            ((xr_file_system *)path.field_2._8_8_,"$game_levels$",profile);
          uVar2 = path.field_2._8_8_;
          if (bVar1) {
            std::operator+(&local_98,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_58,profile);
            bVar1 = xray_re::xr_file_system::create_folder((xr_file_system *)uVar2,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              xray_re::xr_file_system::update_path
                        ((xr_file_system *)path.field_2._8_8_,"$level$","$game_levels$",profile);
              uVar2 = path.field_2._8_8_;
              pcVar3 = profile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b8,pcVar3,&local_b9);
              xray_re::xr_file_system::update_path
                        ((xr_file_system *)uVar2,"$fancy_level$",(string *)local_58,&local_b8);
              std::__cxx11::string::~string((string *)&local_b8);
              std::allocator<char>::~allocator(&local_b9);
              xray_re::msg("processing %s",profile);
              bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,(char *)i,"fix_details");
              if (bVar1) {
                pcVar3 = xray_re::xr_ini_file::r_string(this->m_ini,(char *)i,"fix_details");
                fix_details(this,pcVar3);
              }
              bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,(char *)i,"fix_fences");
              if (bVar1) {
                pcVar3 = xray_re::xr_ini_file::r_string(this->m_ini,(char *)i,"fix_fences");
                fix_fences(this,pcVar3);
              }
            }
            else {
              xray_re::msg("can\'t create output folder for %s",profile);
            }
          }
          else {
            xray_re::msg("can\'t find level %s",profile);
          }
          local_78 = local_78 + 1;
        }
        level._0_4_ = 0;
      }
      else {
        uVar2 = std::__cxx11::string::c_str();
        xray_re::msg("can\'t create output folder %s",uVar2);
        level._0_4_ = 1;
      }
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  return;
}

Assistant:

void fancy_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

	const char* fancy_config;
	if (!cl.get_string("-fancy", fancy_config))
		return;
	m_ini = new xr_ini_file(fancy_config);
	if (m_ini->empty()) {
		msg("can't load %s", fancy_config);
		return;
	}

	xr_file_system& fs = xr_file_system::instance();

	std::string path("gamedata.fancy\\");
	if (cl.get_string("-dir", path))
		fs.append_path_separator(path);
	path.append("levels\\");
	if (!fs.create_path(path)) {
		msg("can't create output folder %s", path.c_str());
		return;
	}

	const char* level;
	const char* profile;
	for (size_t i = 0; m_ini->r_line("levels", i, &level, &profile); ++i) {
		if (!fs.folder_exist(PA_GAME_LEVELS, level)) {
			msg("can't find level %s", level);
			continue;
		}
		if (!fs.create_folder(path + level)) {
			msg("can't create output folder for %s", level);
			continue;
		}
		fs.update_path(PA_LEVEL, PA_GAME_LEVELS, level);
		fs.update_path(PA_FANCY_LEVEL, path, level);
		msg("processing %s", level);
		if (m_ini->line_exist(profile, "fix_details"))
			fix_details(m_ini->r_string(profile, "fix_details"));
		if (m_ini->line_exist(profile, "fix_fences"))
			fix_fences(m_ini->r_string(profile, "fix_fences"));
	}
}